

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

cmStateSnapshot * __thiscall
cmStateSnapshot::GetCallStackBottom(cmStateSnapshot *__return_storage_ptr__,cmStateSnapshot *this)

{
  uint __line;
  bool bVar1;
  PointerType pSVar2;
  char *__assertion;
  iterator other;
  iterator other_00;
  PositionType pos;
  
  if (this->State == (cmState *)0x0) {
    __assertion = "this->State";
    __line = 0x76;
  }
  else {
    other.Tree = &this->State->SnapshotData;
    other.Position = 0;
    bVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator!=
                      (&this->Position,other);
    if (bVar1) {
      pos.Tree = (this->Position).Tree;
      pos.Position = (this->Position).Position;
      while( true ) {
        pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
        if (pSVar2->SnapshotType == BaseType) break;
        pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
        if (pSVar2->SnapshotType == BuildsystemDirectoryType) break;
        other_00.Tree = &this->State->SnapshotData;
        other_00.Position = 0;
        bVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator!=(&pos,other_00);
        if (!bVar1) break;
        cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator++(&pos);
      }
      __return_storage_ptr__->State = this->State;
      (__return_storage_ptr__->Position).Tree = pos.Tree;
      (__return_storage_ptr__->Position).Position = pos.Position;
      return __return_storage_ptr__;
    }
    __assertion = "this->Position != this->State->SnapshotData.Root()";
    __line = 0x77;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmStateSnapshot.cxx"
                ,__line,"cmStateSnapshot cmStateSnapshot::GetCallStackBottom() const");
}

Assistant:

cmStateSnapshot cmStateSnapshot::GetCallStackBottom() const
{
  assert(this->State);
  assert(this->Position != this->State->SnapshotData.Root());

  cmStateDetail::PositionType pos = this->Position;
  while (pos->SnapshotType != cmStateEnums::BaseType &&
         pos->SnapshotType != cmStateEnums::BuildsystemDirectoryType &&
         pos != this->State->SnapshotData.Root()) {
    ++pos;
  }
  return { this->State, pos };
}